

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

uchar * substring(uchar *s,uint start,uint end,uint *new_size)

{
  uchar *puVar1;
  uchar *puVar2;
  uint i;
  uint uVar3;
  char *pcVar4;
  
  uVar3 = end - start;
  pcVar4 = (char *)(ulong)uVar3;
  if (uVar3 != 0) {
    if (new_size != (uint *)0x0) {
      *new_size = uVar3 + 1;
    }
    puVar1 = (uchar *)calloc((ulong)(uVar3 + 2),1);
    puVar2 = puVar1;
    if (start <= end) {
      do {
        *puVar2 = s[start];
        start = start + 1;
        puVar2 = puVar2 + 1;
      } while (start <= end);
    }
    return puVar1;
  }
  substring_cold_1();
  if (*pcVar4 == '\0') {
    return (uchar *)0x0;
  }
  puVar2 = (uchar *)0x0;
  do {
    puVar2 = (uchar *)(ulong)((int)puVar2 + 1);
  } while (pcVar4[(long)puVar2] != '\0');
  return puVar2;
}

Assistant:

uint8_t *substring(uint8_t *s, uint32_t start, uint32_t end, uint32_t *new_size)
{
    if (end - start <= 0)
        fatal("substring", "end-start <= 0\n");

    // size of substr + \0
    uint32_t len = end - start + 1;
    if (new_size != NULL)
        *new_size = len;

    uint8_t *ret = (uint8_t *)calloc(len + 1, sizeof(uint8_t));
    for (uint32_t i = start; i <= end; i++)
        ret[i - start] = s[i];
    return ret;
}